

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::get_environment_value(string *env_name)

{
  char *pcVar1;
  string *in_RDI;
  char *buffer;
  string *ename_string;
  allocator local_41;
  string local_40 [39];
  undefined1 local_19;
  char *local_18;
  
  local_18 = (char *)0x0;
  local_19 = 0;
  ::std::__cxx11::string::string((string *)in_RDI);
  pcVar1 = (char *)::std::__cxx11::string::c_str();
  pcVar1 = getenv(pcVar1);
  if (pcVar1 != (char *)0x0) {
    local_18 = pcVar1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_40,pcVar1,&local_41);
    ::std::__cxx11::string::operator=((string *)in_RDI,local_40);
    ::std::__cxx11::string::~string(local_40);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return in_RDI;
}

Assistant:

std::string get_environment_value(const std::string &env_name) {
    char *buffer = nullptr;
    std::string ename_string;

#ifdef _MSC_VER
    // Windows version
    std::size_t sz = 0;
    if(_dupenv_s(&buffer, &sz, env_name.c_str()) == 0 && buffer != nullptr) {
        ename_string = std::string(buffer);
        free(buffer);
    }
#else
    // This also works on Windows, but gives a warning
    buffer = std::getenv(env_name.c_str());
    if(buffer != nullptr) {
        ename_string = std::string(buffer);
    }
#endif
    return ename_string;
}